

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O0

void learn_randomized(oaa *o,single_learner *base,example *ec)

{
  undefined4 uVar1;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  long in_RDX;
  ulong *in_RDI;
  float fVar5;
  float fVar6;
  uint32_t l;
  size_t count;
  size_t p;
  float weight_temp;
  float best_partial_prediction;
  size_t prediction;
  label_t ld;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  float fVar7;
  example *in_stack_ffffffffffffff98;
  example *ec_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  float local_58;
  ulong local_50;
  ulong local_48;
  float local_3c;
  ulong local_38;
  uint local_20;
  
  uVar3 = *(ulong *)(in_RDX + 0x6828);
  local_20 = (uint)uVar3;
  if ((local_20 == 0) || ((*in_RDI < (uVar3 & 0xffffffff) && (local_20 != 0xffffffff)))) {
    poVar4 = std::operator<<((ostream *)&std::cout,"label ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_20);
    poVar4 = std::operator<<(poVar4," is not in {1,");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*in_RDI);
    poVar4 = std::operator<<(poVar4,"} This won\'t work right.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  *(undefined4 *)(in_RDX + 0x6830) = 0;
  *(undefined8 *)(in_RDX + 0x6828) = 0x3f800000;
  LEARNER::learner<char,_example>::learn
            ((learner<char,_example> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
             ,in_stack_ffffffffffffff98,
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  local_38 = uVar3 & 0xffffffff;
  local_3c = *(float *)(in_RDX + 0x68a8);
  *(undefined4 *)(in_RDX + 0x6828) = 0xbf800000;
  uVar1 = *(undefined4 *)(in_RDX + 0x6870);
  ec_00 = (example *)in_RDI[3];
  fVar5 = (float)(long)*in_RDI;
  local_58 = (float)*in_RDI;
  fVar6 = (float)(long)ec_00;
  fVar7 = (float)ec_00;
  *(float *)(in_RDX + 0x6870) = (local_58 / fVar7) * *(float *)(in_RDX + 0x6870);
  local_48 = in_RDI[5];
  local_50 = 0;
  while (local_50 < in_RDI[3]) {
    iVar2 = *(int *)(in_RDI[4] + local_48 * 4);
    local_48 = (local_48 + 1) % *in_RDI;
    if (iVar2 != local_20 - 1) {
      LEARNER::learner<char,_example>::learn
                ((learner<char,_example> *)CONCAT44(fVar5,in_stack_ffffffffffffffa0),ec_00,
                 CONCAT44(fVar7,fVar6));
      if (local_3c < *(float *)(in_RDX + 0x68a8)) {
        local_3c = *(float *)(in_RDX + 0x68a8);
        local_38 = (ulong)(iVar2 + 1);
      }
      local_50 = local_50 + 1;
    }
  }
  in_RDI[5] = local_48;
  *(int *)(in_RDX + 0x6850) = (int)local_38;
  *(ulong *)(in_RDX + 0x6828) = uVar3;
  *(undefined4 *)(in_RDX + 0x6870) = uVar1;
  return;
}

Assistant:

void learn_randomized(oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTICLASS::label_t ld = ec.l.multi;
  if (ld.label == 0 || (ld.label > o.k && ld.label != (uint32_t)-1))
    cout << "label " << ld.label << " is not in {1," << o.k << "} This won't work right." << endl;

  ec.l.simple = {1., 0.f, 0.f};  // truth
  base.learn(ec, ld.label - 1);

  size_t prediction = ld.label;
  float best_partial_prediction = ec.partial_prediction;

  ec.l.simple.label = -1.;
  float weight_temp = ec.weight;
  ec.weight *= ((float)o.k) / (float)o.num_subsample;
  size_t p = o.subsample_id;
  size_t count = 0;
  while (count < o.num_subsample)
  {
    uint32_t l = o.subsample_order[p];
    p = (p + 1) % o.k;
    if (l == ld.label - 1)
      continue;
    base.learn(ec, l);
    if (ec.partial_prediction > best_partial_prediction)
    {
      best_partial_prediction = ec.partial_prediction;
      prediction = l + 1;
    }
    count++;
  }
  o.subsample_id = p;

  ec.pred.multiclass = (uint32_t)prediction;
  ec.l.multi = ld;
  ec.weight = weight_temp;
}